

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O0

void emitError(StringRef filename,StringRef message,char *position,uint length,int line,int column,
              StringRef buffer)

{
  char *__beg;
  int iVar1;
  iterator pcVar2;
  char *pcVar3;
  ostream *poVar4;
  bool bVar5;
  char local_109;
  uint local_b4;
  char *pcStack_b0;
  uint i;
  char *s;
  string local_a0 [32];
  iterator local_80;
  char *bufferEnd;
  char *bufferBegin;
  char *lineEnd;
  char *lineBegin;
  char *c;
  char *pcStack_50;
  uint length_local;
  char *position_local;
  StringRef message_local;
  StringRef filename_local;
  
  message_local.Data = (char *)message.Length;
  position_local = message.Data;
  message_local.Length = (size_t)filename.Data;
  c._4_4_ = length;
  pcStack_50 = position;
  pcVar2 = llvm::StringRef::begin(&buffer);
  pcVar3 = pcStack_50;
  bVar5 = false;
  if (pcVar2 <= position) {
    pcVar2 = llvm::StringRef::end(&buffer);
    bVar5 = false;
    if (pcVar3 <= pcVar2) {
      bVar5 = true;
    }
  }
  if (!bVar5) {
    __assert_fail("position >= buffer.begin() && position <= buffer.end() && \"invalid position\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandUtil.cpp"
                  ,0x4b,
                  "void emitError(StringRef, StringRef, const char *, unsigned int, int, int, StringRef)"
                 );
  }
  pcVar3 = pcStack_50 + c._4_4_;
  pcVar2 = llvm::StringRef::end(&buffer);
  if (pcVar3 <= pcVar2) {
    if (line == -1) {
      line = 1;
      column = 0;
      for (lineBegin = llvm::StringRef::begin(&buffer); lineBegin != pcStack_50;
          lineBegin = lineBegin + 1) {
        if (*lineBegin == '\n') {
          line = line + 1;
          column = 0;
        }
        else {
          column = column + 1;
        }
      }
    }
    std::ostream::write((char *)&std::cerr,message_local.Length);
    poVar4 = std::operator<<((ostream *)&std::cerr,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,line);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,column);
    std::operator<<(poVar4,": error: ");
    std::ostream::write((char *)&std::cerr,(long)position_local);
    std::operator<<((ostream *)&std::cerr,"\n");
    pcVar3 = pcStack_50;
    pcVar2 = llvm::StringRef::end(&buffer);
    if (pcVar3 != pcVar2) {
      lineEnd = pcStack_50;
      bufferBegin = pcStack_50;
      bufferEnd = llvm::StringRef::begin(&buffer);
      local_80 = llvm::StringRef::end(&buffer);
      while( true ) {
        bVar5 = false;
        if ((bufferEnd < lineEnd) && (bVar5 = false, lineEnd[-1] != '\r')) {
          bVar5 = lineEnd[-1] != '\n';
        }
        if (!bVar5) break;
        lineEnd = lineEnd + -1;
      }
      while( true ) {
        bVar5 = false;
        if ((bufferBegin < local_80) && (bVar5 = false, *bufferBegin != '\r')) {
          bVar5 = *bufferBegin != '\n';
        }
        if (!bVar5) break;
        bufferBegin = bufferBegin + 1;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,"  ");
      __beg = lineEnd;
      pcVar3 = bufferBegin;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                (local_a0,__beg,pcVar3,(allocator<char> *)((long)&s + 7));
      poVar4 = std::operator<<(poVar4,local_a0);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
      std::operator<<((ostream *)&std::cerr,"  ");
      for (pcStack_b0 = lineEnd; pcStack_b0 != pcStack_50; pcStack_b0 = pcStack_b0 + 1) {
        iVar1 = isspace((int)*pcStack_b0);
        if (iVar1 == 0) {
          local_109 = ' ';
        }
        else {
          local_109 = *pcStack_b0;
        }
        std::operator<<((ostream *)&std::cerr,local_109);
      }
      if (c._4_4_ < 2) {
        std::operator<<((ostream *)&std::cerr,'^');
      }
      else {
        for (local_b4 = 0; local_b4 != c._4_4_; local_b4 = local_b4 + 1) {
          std::operator<<((ostream *)&std::cerr,'~');
        }
      }
      std::operator<<((ostream *)&std::cerr,'\n');
    }
    return;
  }
  __assert_fail("position + length <= buffer.end() && \"invalid length\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandUtil.cpp"
                ,0x4c,
                "void emitError(StringRef, StringRef, const char *, unsigned int, int, int, StringRef)"
               );
}

Assistant:

static void emitError(StringRef filename, StringRef message,
                      const char* position, unsigned length,
                      int line, int column,
                      StringRef buffer) {
  assert(position >= buffer.begin() && position <= buffer.end() &&
         "invalid position");
  assert(position + length <= buffer.end() && "invalid length");

  // Compute the line and column, if not provided.
  //
  // FIXME: This is not very efficient, if there are a lot of diagnostics.
  if (line == -1) {
    line = 1;
    column = 0;
    for (const char *c = buffer.begin(); c != position; ++c) {
      if (*c == '\n') {
        ++line;
        column = 0;
      } else {
        ++column;
      }
    }
  }

  std::cerr.write(filename.data(), filename.size());
  std::cerr << ":" << line << ":" << column << ": error: ";
  std::cerr.write(message.data(), message.size());
  std::cerr << "\n";

  // Skip carat diagnostics on EOF token.
  if (position == buffer.end())
    return;

  // Simple caret style diagnostics.
  const char *lineBegin = position, *lineEnd = position;
  const char *bufferBegin = buffer.begin(), *bufferEnd = buffer.end();

  // Run line pointers forward and back.
  while (lineBegin > bufferBegin &&
         lineBegin[-1] != '\r' && lineBegin[-1] != '\n')
    --lineBegin;
  while (lineEnd < bufferEnd &&
         lineEnd[0] != '\r' && lineEnd[0] != '\n')
    ++lineEnd;

  // Show the line, indented by 2.
  std::cerr << "  " << std::string(lineBegin, lineEnd) << "\n";

  // Show the caret or squiggly, making sure to print back spaces the same.
  std::cerr << "  ";
  for (const char* s = lineBegin; s != position; ++s)
    std::cerr << (isspace(*s) ? *s : ' ');
  if (length > 1) {
    for (unsigned i = 0; i != length; ++i)
      std::cerr << '~';
  } else {
    std::cerr << '^';
  }
  std::cerr << '\n';
}